

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O1

int fwd_on_outgoing_interest
              (uint8_t *interest,size_t length,uint8_t *name,size_t name_len,ndn_pit_entry_t *entry,
              ndn_table_id_t face_id)

{
  int iVar1;
  ndn_fib_entry_t *pnVar2;
  uint8_t *puVar3;
  ndn_bitset_t nVar4;
  bool bVar5;
  
  pnVar2 = ndn_fib_prefix_match(forwarder.fib,name,name_len);
  if (pnVar2 == (ndn_fib_entry_t *)0x0) {
    printf("ERROR: %s, L%d: ","fwd_on_outgoing_interest",0x1b4);
    puts("[FORWARDER] Drop by no route");
    iVar1 = -0x38;
  }
  else {
    if (pnVar2->on_interest == (ndn_on_interest_func)0x0) {
      bVar5 = true;
    }
    else {
      iVar1 = (*pnVar2->on_interest)(interest,(uint32_t)length,pnVar2->userdata);
      bVar5 = iVar1 == 1;
    }
    iVar1 = 0;
    if (entry->nametree_id != 0xffff) {
      puVar3 = tlv_interest_get_hoplimit_ptr(interest,length);
      if (puVar3 != (uint8_t *)0x0) {
        if (*puVar3 == '\0') {
          return -0x37;
        }
        if (face_id != 0xffff) {
          *puVar3 = *puVar3 + 0xff;
        }
      }
      if (bVar5) {
        nVar4 = fwd_multicast(interest,length,~entry->outgoing_faces & pnVar2->nexthop,face_id);
        entry->outgoing_faces = entry->outgoing_faces | nVar4;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
fwd_on_outgoing_interest(uint8_t* interest,
                         size_t length,
                         uint8_t* name,
                         size_t name_len,
                         ndn_pit_entry_t* entry,
                         ndn_table_id_t face_id)
{
  ndn_fib_entry_t* fib_entry;
  int strategy;
  uint8_t *hop_limit;
  ndn_bitset_t outfaces;

  fib_entry = ndn_fib_prefix_match(forwarder.fib, name, name_len);
  if(fib_entry == NULL){
    NDN_LOG_ERROR("[FORWARDER] Drop by no route\n");
    return NDN_FWD_NO_ROUTE;
  }

  if(fib_entry->on_interest){
    strategy = fib_entry->on_interest(interest, length, fib_entry->userdata);
  }else{
    strategy = NDN_FWD_STRATEGY_MULTICAST;
  }

  // The interest may be satisfied immediately so check again
  if(entry->nametree_id == NDN_INVALID_ID){
    return NDN_SUCCESS;
  }

  hop_limit = tlv_interest_get_hoplimit_ptr(interest, length);
  if(hop_limit != NULL){
    if(*hop_limit <= 0){
      return NDN_FWD_INTEREST_REJECTED;
    }
    // If the Interest is received from another hop
    if(face_id != NDN_INVALID_ID){
      *hop_limit -= 1;
    }
  }

  outfaces = (fib_entry->nexthop & (~entry->outgoing_faces));
  if(strategy == NDN_FWD_STRATEGY_MULTICAST){
    entry->outgoing_faces |= fwd_multicast(interest, length, outfaces, face_id);
  }

  return NDN_SUCCESS;
}